

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O1

D_Sym * new_D_Sym(D_Scope *st,char *name,char *end,int sizeof_D_Sym)

{
  uint uVar1;
  size_t sVar2;
  D_Sym *s;
  int l;
  
  if (end == (char *)0x0) {
    if (name == (char *)0x0) {
      l = 0;
    }
    else {
      sVar2 = strlen(name);
      l = (int)sVar2;
    }
  }
  else {
    l = (int)end - (int)name;
  }
  s = (D_Sym *)malloc((long)sizeof_D_Sym);
  memset(s,0,(long)sizeof_D_Sym);
  s->name = name;
  s->len = l;
  uVar1 = strhashl(name,l);
  s->hash = uVar1;
  s->scope = st;
  if (st != (D_Scope *)0x0) {
    if (st->hash == (D_SymHash *)0x0) {
      s->next = st->ll;
      st->ll = s;
    }
    else {
      symhash_add(st->hash,s);
    }
  }
  return s;
}

Assistant:

D_Sym *new_D_Sym(D_Scope *st, char *name, char *end, int sizeof_D_Sym) {
  uint len = end ? end - name : name ? strlen(name) : 0;
  D_Sym *s = MALLOC(sizeof_D_Sym);
  memset(s, 0, sizeof_D_Sym);
  s->name = name;
  s->len = len;
  s->hash = strhashl(name, len);
  s->scope = st;
  if (st) {
    if (st->hash) {
      symhash_add(st->hash, s);
    } else {
      s->next = st->ll;
      st->ll = s;
    }
  }
  return s;
}